

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O3

size_t FindFreeCells(void *page,size_t number,size_t index)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t remaining;
  long lVar7;
  size_t sVar8;
  
  if (index < 0x80) {
    uVar3 = index >> 3;
    uVar4 = index & 0xfffffffffffffff8;
    lVar7 = -uVar4;
    sVar2 = 0xffffffffffffffff;
    sVar8 = number;
    do {
      uVar4 = uVar4 + 8;
      uVar5 = (ulong)*(byte *)((long)page + uVar3 + 0x10);
      if (sVar8 < 8) {
        cVar1 = ""[uVar5 + sVar8 * 0x100];
        if ((long)cVar1 != -1) {
          if (sVar8 == number) {
            return cVar1 - lVar7;
          }
          if (cVar1 == '\0') {
            return sVar2;
          }
        }
LAB_00107527:
        lVar6 = (long)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                      [uVar5];
        sVar8 = number;
        if (lVar6 != 0) {
          sVar2 = uVar4 - lVar6;
          sVar8 = number - lVar6;
        }
      }
      else {
        if (sVar8 == number) goto LAB_00107527;
        sVar8 = sVar8 - 8;
        if (uVar5 != 0) {
          sVar8 = number;
        }
      }
      if (sVar8 == 0) {
        return sVar2;
      }
      uVar3 = uVar3 + 1;
      lVar7 = lVar7 + -8;
    } while (uVar3 != 0x10);
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
FindFreeCells(
    void *page,     /*!< Page to look into. */
    size_t number,  /*!< Number of cells to look for. */
    size_t index)   /*!< First cell to consider. */
{
    size_t i, first = (size_t)-1, remaining;
    char seq;
    unsigned char *mask = PAGE_BITMASK(page);

    /*
     * Iterate over bytes of the bitmask to find a chain of <number> zero bits.
     */

    ASSERT(number <= AVAILABLE_CELLS);
    remaining = number;
    for (i = (index>>3); i < (CELLS_PER_PAGE>>3); i++) {
        if (remaining <= 7) {
            /*
             * End of sequence, or whole sequence for number < 8.
             * Find sequence in byte.
             */

            seq = firstZeroBitSequence[remaining-1][mask[i]];
            if (seq != -1) {
                if (remaining == number) {
                    /*
                     * Sequence fits into one byte.
                     */

                    return (i<<3) + seq;
                }

                /*
                 * Sequence spans over several bytes.
                 */

                if (seq == 0) {
                    /*
                     * Sequence is contiguous.
                     */

                    return first;
                }
            }

            /*
             * Sequence interrupted, restart.
             */

            remaining = number;
        }

        /*
         * Sequence may span over several bytes.
         */

        if (remaining == number) {
            /*
             * Beginning of sequence.
             *
             * @note leading bits actually denote trailing cells: bit 0 (LSB) is
             * first cell, bit 7 (MSB) is last.
             */

            seq = longestLeadingZeroBitSequence[mask[i]];
            if (seq) {
                first = (i<<3) + (8-seq);
                remaining -= seq;
            }
        } else {
            /*
             * Middle of sequence, look for 8 bits cleared = zero byte.
             */

            if (mask[i] == 0) {
                /*
                 * Continue sequence.
                 */

                remaining -= 8;
            } else {
                /*
                 * Sequence interrupted, restart.
                 */

                remaining = number;
            }
        }
        if (remaining == 0) {
            /*
             * End of sequence reached.
             */

            return first;
        }
    }

    /*
     * None found.
     */

    return (size_t)-1;
}